

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

Vec_Int_t * Cba_NtkCollectInFons(Cba_Ntk_t *p,Vec_Int_t *vObjs)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  byte bVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  void *__s;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  size_t __size;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(400);
  p_00->pArray = piVar6;
  uVar9 = (p->vFonObj).nSize;
  iVar13 = (((int)uVar9 >> 5) + 1) - (uint)((uVar9 & 0x1f) == 0);
  if (iVar13 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar13 << 2;
    __s = malloc(__size);
  }
  uVar9 = iVar13 * 0x20;
  memset(__s,0,__size);
  iVar2 = vObjs->nSize;
  lVar7 = (long)iVar2;
  if (0 < lVar7) {
    piVar6 = vObjs->pArray;
    lVar10 = 0;
    do {
      uVar11 = piVar6[lVar10];
      if ((int)uVar11 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x154,"int Cba_ObjFin0(Cba_Ntk_t *, int)");
      }
      uVar8 = (p->vObjFin0).nSize;
      if (((int)uVar8 <= (int)uVar11) || (uVar8 <= uVar11 + 1)) goto LAB_00337cf8;
      piVar4 = (p->vObjFin0).pArray;
      uVar8 = piVar4[uVar11];
      uVar12 = (ulong)uVar8;
      iVar3 = piVar4[(ulong)uVar11 + 1];
      uVar11 = uVar8;
      while ((int)uVar11 < iVar3) {
        if ((int)uVar8 < 1) {
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= (int)uVar12) goto LAB_00337cf8;
        uVar11 = (p->vFinFon).pArray[uVar12];
        if (0 < (int)uVar11) {
          if ((int)uVar9 <= (int)uVar11) goto LAB_00337cd9;
          puVar1 = (uint *)((long)__s + (ulong)(uVar11 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)uVar11 & 0x1f);
        }
        uVar12 = uVar12 + 1;
        uVar11 = (uint)uVar12;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar7);
    if (0 < iVar2) {
      piVar6 = vObjs->pArray;
      lVar10 = 0;
      do {
        uVar11 = piVar6[lVar10];
        if ((int)uVar11 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
        }
        uVar8 = (p->vObjFon0).nSize;
        if (((int)uVar8 <= (int)uVar11) || (uVar8 <= uVar11 + 1)) {
LAB_00337cf8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = (p->vObjFon0).pArray;
        iVar2 = piVar4[(ulong)uVar11 + 1];
        uVar11 = piVar4[uVar11];
        for (uVar8 = uVar11; (int)uVar8 < iVar2; uVar8 = uVar8 + 1) {
          if (((int)uVar11 < 0) || ((int)uVar9 <= (int)uVar8)) {
LAB_00337cd9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          bVar5 = (byte)uVar8 & 0x1f;
          puVar1 = (uint *)((long)__s + (ulong)(uVar8 >> 5) * 4);
          *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar7);
    }
  }
  if (iVar13 < 1) {
    if (__s == (void *)0x0) {
      return p_00;
    }
  }
  else {
    uVar11 = 1;
    if (1 < (int)uVar9) {
      uVar11 = uVar9;
    }
    uVar9 = 0;
    do {
      if ((*(uint *)((long)__s + (ulong)(uVar9 >> 5) * 4) >> (uVar9 & 0x1f) & 1) != 0) {
        Vec_IntPush(p_00,uVar9);
      }
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  free(__s);
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectInFons( Cba_Ntk_t * p, Vec_Int_t * vObjs )
{
    Vec_Int_t * vFons = Vec_IntAlloc( 100 );
    Vec_Bit_t * vVisFons = Vec_BitStart( Cba_NtkFonNum(p) + 1 );
    int i, k, iObj, iFin, iFon, Entry;
    // mark fanin fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFinFon( p, iObj, iFin, iFon, k )
            if ( iFon > 0 )
                Vec_BitWriteEntry( vVisFons, iFon, 1 );
    // unmark internal fons
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjForEachFon( p, iObj, iFon, k )
            Vec_BitWriteEntry( vVisFons, iFon, 0 );
    // collect fons
    Vec_BitForEachEntry( vVisFons, Entry, iFon )
        if ( Entry )
            Vec_IntPush( vFons, iFon );
    Vec_BitFree( vVisFons );
    return vFons;
}